

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O1

void cjson_minify_should_remove_multiline_comments(void)

{
  char *json;
  
  json = (char *)malloc(0x33);
  if (json == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x4d);
  }
  builtin_strncpy(json,"{/* this is\n a /* multi\n //line \n {comment \"\\\" */}",0x33);
  cJSON_Minify(json);
  UnityAssertEqualString("{}",json,(char *)0x0,0x51);
  free(json);
  return;
}

Assistant:

static void cjson_minify_should_remove_multiline_comments(void)
{
    const char to_minify[] = "{/* this is\n a /* multi\n //line \n {comment \"\\\" */}";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{}", minified);

    free(minified);
}